

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O2

int io_file_iter(lua_State *L)

{
  IOFileUD *iof;
  int iVar1;
  int iVar2;
  TValue *__dest;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  __dest = L->base;
  uVar3 = __dest[-2].u64 & 0x7fffffffffff;
  uVar5 = *(ulong *)(uVar3 + 0x30) & 0x7fffffffffff;
  if (*(long *)(uVar5 + 0x30) == 0) {
    lj_err_caller(L,LJ_ERR_IOCLFL);
  }
  iof = (IOFileUD *)(uVar5 + 0x30);
  uVar4 = (ulong)*(byte *)(uVar3 + 0xb) - 1;
  L->top = __dest;
  if ((MSize)uVar4 != 0) {
    if ((long)((L->maxstack).ptr64 - (long)__dest) <= (long)((uVar4 & 0xffffffff) * 8)) {
      lj_state_growstack(L,(MSize)uVar4);
      __dest = L->top;
    }
    memcpy(__dest,(void *)(uVar3 + 0x38),uVar4 * 8);
    L->top = L->top + uVar4;
  }
  iVar1 = io_file_read(L,iof,0);
  iVar2 = ferror((FILE *)iof->fp);
  if (iVar2 == 0) {
    if ((L->base->u64 == 0xffffffffffffffff) && ((*(byte *)(uVar5 + 0x38) & 4) != 0)) {
      io_file_close(L,iof);
      iVar1 = 0;
    }
    return iVar1;
  }
  lj_err_callermsg(L,(char *)((L->top[-2].u64 & 0x7fffffffffff) + 0x18));
}

Assistant:

static int io_file_iter(lua_State *L)
{
  GCfunc *fn = curr_func(L);
  IOFileUD *iof = uddata(udataV(&fn->c.upvalue[0]));
  int n = fn->c.nupvalues - 1;
  if (iof->fp == NULL)
    lj_err_caller(L, LJ_ERR_IOCLFL);
  L->top = L->base;
  if (n) {  /* Copy upvalues with options to stack. */
    lj_state_checkstack(L, (MSize)n);
    memcpy(L->top, &fn->c.upvalue[1], n*sizeof(TValue));
    L->top += n;
  }
  n = io_file_read(L, iof, 0);
  if (ferror(iof->fp))
    lj_err_callermsg(L, strVdata(L->top-2));
  if (tvisnil(L->base) && (iof->type & IOFILE_FLAG_CLOSE)) {
    io_file_close(L, iof);  /* Return values are ignored. */
    return 0;
  }
  return n;
}